

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O1

void __thiscall BufferReader::BufferReader(BufferReader *this,int size)

{
  buf_t *pbVar1;
  ulong uVar2;
  
  *(undefined ***)&this->field_0x28 = &PTR___cxa_pure_virtual_0011ad80;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__Buffer_00119e68;
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = (long)size;
  }
  pbVar1 = (buf_t *)operator_new__(uVar2);
  (this->super_Buffer).buf_current = pbVar1;
  (this->super_Buffer).buf_start = pbVar1;
  (this->super_Buffer).buf_end = pbVar1 + size;
  (this->super_Buffer)._vptr_Buffer = (_func_int **)0x119e90;
  *(undefined8 *)&this->field_0x28 = 0x119ec8;
  this->read_end = pbVar1;
  return;
}

Assistant:

BufferReader::BufferReader(int size) : Buffer(size) {
  read_end = buf_start;
}